

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O2

WebSocketMsg * __thiscall asl::WebSocketMsg::fix(WebSocketMsg *this)

{
  uchar local_9;
  
  local_9 = '\0';
  Array<unsigned_char>::operator<<(&this->_data,&local_9);
  Array<unsigned_char>::resize(&this->_data,*(int *)((this->_data)._a + -0x10) + -1);
  return this;
}

Assistant:

WebSocketMsg& WebSocketMsg::fix()
{
	_data << byte(0);
	_data.resize(_data.length() - 1);
	return *this;
}